

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  QLayoutItem *pQVar1;
  Stream *pSVar2;
  QDebug *pQVar3;
  long in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QLayoutItem *local_30;
  QDockAreaLayoutInfo *local_28;
  QPlaceHolderItem *local_20;
  
  local_20 = *(QPlaceHolderItem **)(in_FS_OFFSET + 0x28);
  local_28 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_28,(QDebug *)item);
  pQVar1 = item->widgetItem;
  *(undefined1 *)&pQVar1[3]._vptr_QLayoutItem = 0;
  if (in_RDX == 0) {
    pQVar3 = QDebug::operator<<((QDebug *)item,"QDockAreaLayoutItem(0x0)");
    pSVar2 = pQVar3->stream;
    *(Stream **)dbg.stream = pSVar2;
    pSVar2 = pSVar2 + 0x28;
    *(int *)pSVar2 = *(int *)pSVar2 + 1;
  }
  else {
    pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
    local_30 = pQVar1;
    operator<<(dbg,(QDockAreaLayoutItem *)&local_30);
    QDebug::~QDebug((QDebug *)&local_30);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_28);
  if (*(QPlaceHolderItem **)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem *item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    return item ? dbg << *item : dbg << "QDockAreaLayoutItem(0x0)";
}